

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

void __thiscall
vkt::memory::anon_unknown_0::SubmitCommandBuffer::~SubmitCommandBuffer(SubmitCommandBuffer *this)

{
  size_type sVar1;
  reference ppCVar2;
  ulong local_18;
  size_t cmdNdx;
  SubmitCommandBuffer *this_local;
  
  (this->super_Command)._vptr_Command = (_func_int **)&PTR__SubmitCommandBuffer_01667758;
  local_18 = 0;
  while( true ) {
    sVar1 = std::
            vector<vkt::memory::(anonymous_namespace)::CmdCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::CmdCommand_*>_>
            ::size(&this->m_commands);
    if (sVar1 <= local_18) break;
    ppCVar2 = std::
              vector<vkt::memory::(anonymous_namespace)::CmdCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::CmdCommand_*>_>
              ::operator[](&this->m_commands,local_18);
    if (*ppCVar2 != (value_type)0x0) {
      (*(*ppCVar2)->_vptr_CmdCommand[1])();
    }
    local_18 = local_18 + 1;
  }
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&this->m_commandBuffer);
  std::
  vector<vkt::memory::(anonymous_namespace)::CmdCommand_*,_std::allocator<vkt::memory::(anonymous_namespace)::CmdCommand_*>_>
  ::~vector(&this->m_commands);
  Command::~Command(&this->super_Command);
  return;
}

Assistant:

SubmitCommandBuffer::~SubmitCommandBuffer (void)
{
	for (size_t cmdNdx = 0; cmdNdx < m_commands.size(); cmdNdx++)
		delete m_commands[cmdNdx];
}